

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_msg *
handle_think_tag_prelude
          (string *input,bool extract_reasoning,
          function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *rest_parser)

{
  bool bVar1;
  int iVar2;
  string *str;
  ulong uVar3;
  ostream *poVar4;
  byte in_DL;
  common_chat_msg *in_RDI;
  ostringstream content;
  string reasoning_content;
  string_type rest;
  smatch match;
  common_chat_msg *msg;
  common_chat_msg *in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  common_chat_msg *pcVar5;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffdb0;
  ostringstream local_230 [376];
  string local_b8 [32];
  string local_98 [39];
  byte local_71;
  string local_70 [95];
  byte local_11;
  
  local_11 = in_DL & 1;
  pcVar5 = in_RDI;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffd70);
  if ((handle_think_tag_prelude(std::__cxx11::string_const&,bool,std::function<common_chat_msg(std::__cxx11::string_const&)>const&)
       ::reasoning_content_regex_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&handle_think_tag_prelude(std::__cxx11::string_const&,bool,std::function<common_chat_msg(std::__cxx11::string_const&)>const&)
                                   ::reasoning_content_regex_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffffdb0,
               (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               (flag_type)((ulong)pcVar5 >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &handle_think_tag_prelude(std::__cxx11::string_const&,bool,std::function<common_chat_msg(std::__cxx11::string_const&)>const&)
                  ::reasoning_content_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handle_think_tag_prelude(std::__cxx11::string_const&,bool,std::function<common_chat_msg(std::__cxx11::string_const&)>const&)
                         ::reasoning_content_regex_abi_cxx11_);
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffd88,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     in_stack_fffffffffffffd80,(match_flag_type)(in_stack_fffffffffffffd78 >> 0x20))
  ;
  if (bVar1) {
    str = (string *)
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_71 = 0;
    std::
    function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)str,in_stack_fffffffffffffd80);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    string_strip(str);
    std::__cxx11::string::~string(local_b8);
    if ((local_11 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_230);
        poVar4 = std::operator<<((ostream *)local_230,"<think>");
        in_stack_fffffffffffffd70 = (common_chat_msg *)std::operator<<(poVar4,local_98);
        poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffd70,"</think>");
        std::operator<<(poVar4,(string *)&in_RDI->content);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=
                  ((string *)&in_RDI->content,(string *)&stack0xfffffffffffffdb0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
        std::__cxx11::ostringstream::~ostringstream(local_230);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&in_RDI->reasoning_content,local_98);
    }
    local_71 = 1;
    std::__cxx11::string::~string(local_98);
    if ((local_71 & 1) == 0) {
      common_chat_msg::~common_chat_msg(in_stack_fffffffffffffd70);
    }
    std::__cxx11::string::~string(local_70);
  }
  else {
    std::
    function<common_chat_msg_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x294aef);
  return pcVar5;
}

Assistant:

static common_chat_msg handle_think_tag_prelude(const std::string & input, bool extract_reasoning, const std::function<common_chat_msg(const std::string &)> & rest_parser) {
    std::smatch match;
    static const std::regex reasoning_content_regex("((?:<think>)?([\\s\\S\\r\\n]*?)</think>)?([\\s\\S\\r\\n]*)");
    if (std::regex_match(input, match, reasoning_content_regex)) {
        auto rest = match[3].str();
        auto msg = rest_parser(rest);
        auto reasoning_content = string_strip(match[2].str());
        if (extract_reasoning) {
            msg.reasoning_content = reasoning_content;
        } else if (!reasoning_content.empty()) {
            std::ostringstream content;
            content << "<think>" << reasoning_content << "</think>" << msg.content;
            msg.content = content.str();
        }
        return msg;
    }
    return rest_parser(input);
}